

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::repetitionsToStr
          (LineContinuationTest *this,REPETITIONS repetitions)

{
  GLchar *pGVar1;
  
  pGVar1 = "multiple";
  if (repetitions == ONCE) {
    pGVar1 = "single";
  }
  return pGVar1;
}

Assistant:

const GLchar* LineContinuationTest::repetitionsToStr(REPETITIONS repetitions) const
{
	const GLchar* result = 0;

	if (ONCE == repetitions)
	{
		result = "single";
	}
	else
	{
		result = "multiple";
	}

	return result;
}